

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::Matchers::Impl::StdString::StartsWith::~StartsWith(StartsWith *this)

{
  pointer pcVar1;
  
  (this->
  super_MatcherImpl<Catch::Matchers::Impl::StdString::StartsWith,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ).super_Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__StartsWith_00175180;
  pcVar1 = (this->m_data).m_str._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 == &(this->m_data).m_str.field_2) {
    return;
  }
  operator_delete(pcVar1);
  return;
}

Assistant:

Matchers::Impl::StdString::StartsWith::~StartsWith() {}